

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O2

void __thiscall avro::istream::~istream(istream *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_istream)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_istream)._vptr_basic_istream + (long)pp_Var1[-3]) = vtt[3];
  istreambuf::~istreambuf((istreambuf *)&(this->super_istream).field_0x10);
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_istream)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_istream)._vptr_basic_istream + (long)pp_Var1[-3]) = vtt[2];
  (this->super_istream)._M_gcount = 0;
  return;
}

Assistant:

class AVRO_DECL istream : public std::istream {

  public:

    /// Constructor, requires an InputBuffer to read from.
    explicit istream(const InputBuffer &buf) : 
        std::istream(&ibuf_), ibuf_(buf)
    { }

    /// Constructor, takes an OutputBuffer to read from (by making a shallow copy to an InputBuffer).
    /// Writing to the OutputBuffer while an istream is using it may lead to undefined behavior.
    explicit istream(const OutputBuffer &buf) : 
        std::istream(&ibuf_), ibuf_(buf)
    { }

    /// Return the InputBuffer this stream is reading from.
    const InputBuffer &getBuffer() const {
        return ibuf_.getBuffer();
    }

  protected:

    istreambuf ibuf_;
}